

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::AlignTextToFramePadding(void)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *pIVar2;
  float fVar3;
  ImGuiContext *g;
  ImGuiWindow *window;
  
  pIVar2 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar2->SkipItems & 1U) == 0) {
    fVar3 = (GImGui->Style).FramePadding.y;
    fVar3 = ImMax<float>((pIVar2->DC).CurrentLineSize.y,fVar3 + fVar3 + GImGui->FontSize);
    (pIVar2->DC).CurrentLineSize.y = fVar3;
    fVar3 = ImMax<float>((pIVar2->DC).CurrentLineTextBaseOffset,(pIVar1->Style).FramePadding.y);
    (pIVar2->DC).CurrentLineTextBaseOffset = fVar3;
  }
  return;
}

Assistant:

void ImGui::AlignTextToFramePadding()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    window->DC.CurrentLineSize.y = ImMax(window->DC.CurrentLineSize.y, g.FontSize + g.Style.FramePadding.y * 2);
    window->DC.CurrentLineTextBaseOffset = ImMax(window->DC.CurrentLineTextBaseOffset, g.Style.FramePadding.y);
}